

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void __thiscall r_exec::View::mod(View *this,uint16_t member_index,double value)

{
  double value_local;
  uint16_t member_index_local;
  View *this_local;
  
  switch(member_index) {
  case 3:
    mod_sln(this,value);
    break;
  case 4:
    mod_res(this,value);
    break;
  case 7:
    mod_act(this,value);
    break;
  case 8:
    mod_vis(this,value);
  }
  return;
}

Assistant:

void View::mod(uint16_t member_index, double value)
{
    switch (member_index) {
    case VIEW_SLN:
        mod_sln(value);
        break;

    case VIEW_RES:
        mod_res(value);
        break;

    case VIEW_ACT:
        mod_act(value);
        break;

    case GRP_VIEW_VIS:
        mod_vis(value);
        break;
    }
}